

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerNewConcatStrMulti(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  RegOpnd *pRVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 value;
  Opnd *pOVar5;
  long lVar6;
  undefined4 *puVar7;
  size_t allocSize;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2c;
  byte local_29;
  RegOpnd *pRStack_28;
  uint8 count;
  RegOpnd *dstOpnd;
  IntConstOpnd *countOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  countOpnd = (IntConstOpnd *)instr;
  instr_local = (Instr *)this;
  pOVar5 = IR::Instr::UnlinkSrc1(instr);
  dstOpnd = (RegOpnd *)IR::Opnd::AsIntConstOpnd(pOVar5);
  pOVar5 = IR::Instr::UnlinkDst((Instr *)countOpnd);
  pRStack_28 = IR::Opnd::AsRegOpnd(pOVar5);
  lVar6 = IR::EncodableOpnd<long>::GetValue((EncodableOpnd<long> *)&dstOpnd->m_sym);
  local_29 = (byte)lVar6;
  local_2c.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRStack_28->super_Opnd);
  bVar3 = ValueType::IsString((ValueType *)&local_2c.field_0);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x65c2,"(dstOpnd->GetValueType().IsString())",
                       "dstOpnd->GetValueType().IsString()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  allocSize = Js::ConcatStringMulti::GetAllocSize((uint)local_29);
  GenerateRecyclerAlloc
            (this,HelperAllocMemForConcatStringMulti,allocSize,pRStack_28,(Instr *)countOpnd,false);
  pRVar2 = pRStack_28;
  pOVar5 = LoadVTableValueOpnd(this,(Instr *)countOpnd,VtableConcatStringMulti);
  GenerateRecyclerMemInit(this,pRVar2,0,pOVar5,(Instr *)countOpnd);
  pRVar2 = pRStack_28;
  uVar4 = Js::RecyclableObject::GetOffsetOfType();
  pOVar5 = LoadLibraryValueOpnd(this,(Instr *)countOpnd,ValueStringTypeStatic);
  GenerateRecyclerMemInit(this,pRVar2,uVar4,pOVar5,(Instr *)countOpnd);
  pRVar2 = pRStack_28;
  uVar4 = Js::JavascriptString::GetOffsetOfpszValue();
  GenerateRecyclerMemInitNull(this,pRVar2,uVar4,(Instr *)countOpnd);
  pRVar2 = pRStack_28;
  uVar4 = Js::JavascriptString::GetOffsetOfcharLength();
  GenerateRecyclerMemInit(this,pRVar2,uVar4,0,(Instr *)countOpnd);
  pRVar2 = pRStack_28;
  uVar4 = Js::ConcatStringMulti::GetOffsetOfSlotCount();
  value = IR::IntConstOpnd::AsUint32((IntConstOpnd *)dstOpnd);
  GenerateRecyclerMemInit(this,pRVar2,uVar4,value,(Instr *)countOpnd);
  IR::Instr::Remove((Instr *)countOpnd);
  return;
}

Assistant:

void
Lowerer::LowerNewConcatStrMulti(IR::Instr * instr)
{
    IR::IntConstOpnd * countOpnd = instr->UnlinkSrc1()->AsIntConstOpnd();
    IR::RegOpnd * dstOpnd = instr->UnlinkDst()->AsRegOpnd();
    uint8 count = (uint8)countOpnd->GetValue();

    Assert(dstOpnd->GetValueType().IsString());

    GenerateRecyclerAlloc(IR::HelperAllocMemForConcatStringMulti, Js::ConcatStringMulti::GetAllocSize(count), dstOpnd, instr);

    GenerateRecyclerMemInit(dstOpnd, 0, this->LoadVTableValueOpnd(instr, VTableValue::VtableConcatStringMulti), instr);
    GenerateRecyclerMemInit(dstOpnd, Js::ConcatStringMulti::GetOffsetOfType(),
        this->LoadLibraryValueOpnd(instr, LibraryValue::ValueStringTypeStatic), instr);
    GenerateRecyclerMemInitNull(dstOpnd, Js::ConcatStringMulti::GetOffsetOfpszValue(), instr);
    GenerateRecyclerMemInit(dstOpnd, Js::ConcatStringMulti::GetOffsetOfcharLength(), 0, instr);
    GenerateRecyclerMemInit(dstOpnd, Js::ConcatStringMulti::GetOffsetOfSlotCount(), countOpnd->AsUint32(), instr);

    instr->Remove();
}